

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyNPY.cpp
# Opt level: O0

LPCSTR NpyArray::ParseHeaderNPY
                 (uint8_t *buffer,shape_t *shape,size_t *wordSize,char *type,bool *fortranOrder)

{
  int iVar1;
  ulong uVar2;
  LPCSTR pcVar3;
  ulong uVar4;
  allocator local_61;
  undefined1 local_60 [8];
  string header;
  uint32_t offset;
  uint32_t lenHeader;
  bool *fortranOrder_local;
  char *type_local;
  size_t *wordSize_local;
  shape_t *shape_local;
  uint8_t *buffer_local;
  
  if ((*buffer == 0x93) && (iVar1 = strncmp((char *)(buffer + 1),"NUMPY",5), iVar1 == 0)) {
    if (buffer[6] < 2) {
      header.field_2._12_4_ = ZEXT24(*(ushort *)(buffer + 8));
      header.field_2._8_4_ = 10;
    }
    else {
      header.field_2._12_4_ =
           (uint)buffer[0xb] << 0x18 | (uint)buffer[10] << 0x10 | (uint)buffer[9] << 8 |
           (uint)buffer[8];
      header.field_2._8_4_ = 0xc;
    }
    uVar4 = (ulong)(uint)header.field_2._8_4_;
    uVar2 = (ulong)(uint)header.field_2._12_4_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_60,(char *)(buffer + uVar4),uVar2,&local_61);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    pcVar3 = ParseHeaderNPY((string *)local_60,shape,wordSize,type,fortranOrder);
    std::__cxx11::string::~string((string *)local_60);
    return pcVar3;
  }
  return "error: invalid header id";
}

Assistant:

LPCSTR NpyArray::ParseHeaderNPY(const uint8_t* buffer, shape_t& shape, size_t& wordSize, char& type, bool& fortranOrder)
{
	if (buffer[0] != (uint8_t)0x93 || _tcsncmp(reinterpret_cast<const char*>(buffer+1), "NUMPY", 5) != 0)
		return "error: invalid header id";
	// parse the length of the header data
	uint32_t lenHeader, offset;
	ASSERT(buffer[7] >= 0); // minor version number of the file format
	if (buffer[6] > 1) { // major version number of the file format
		// little-endian unsigned int
		lenHeader = (uint32_t(buffer[11])<<24)|(uint32_t(buffer[10])<<16)|(uint32_t(buffer[9])<<8)|uint32_t(buffer[8]);
		offset = 12;
	} else {
		// little-endian unsigned short int
		lenHeader = (uint16_t(buffer[9])<<8)|uint16_t(buffer[8]);
		offset = 10;
	}
	const std::string header(reinterpret_cast<const char*>(buffer+offset), lenHeader);
	return ParseHeaderNPY(header, shape, wordSize, type, fortranOrder);
}